

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmPre.c
# Opt level: O1

Ifd_Man_t * Ifd_ManStart(void)

{
  uint uVar1;
  Ifd_Man_t *pIVar2;
  Ifd_Obj_t *pIVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Int_t *pVVar6;
  Hsh_IntMan_t *pHVar7;
  Vec_Wrd_t *pVVar8;
  word *pwVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  
  pIVar2 = (Ifd_Man_t *)calloc(1,0x48);
  uVar11 = 49999999;
  while( true ) {
    do {
      uVar10 = uVar11 + 1;
      uVar1 = uVar11 & 1;
      uVar11 = uVar10;
    } while (uVar1 != 0);
    if (uVar10 < 9) break;
    iVar12 = 5;
    while (uVar10 % (iVar12 - 2U) != 0) {
      uVar1 = iVar12 * iVar12;
      iVar12 = iVar12 + 2;
      if (uVar10 < uVar1) goto LAB_0040aa9b;
    }
  }
LAB_0040aa9b:
  pIVar2->nObjsAlloc = uVar10;
  pIVar2->nObjs = 2;
  pIVar3 = (Ifd_Obj_t *)calloc((long)(int)uVar10,0x10);
  pIVar2->pObjs = pIVar3;
  *(undefined4 *)pIVar3 = 0xffffffff;
  pIVar3->pFans[0] = 0xffffffff;
  pIVar3->pFans[1] = 0xffffffff;
  pIVar3->pFans[2] = 0xffffffff;
  *(uint *)(pIVar3 + 1) = *(uint *)(pIVar3 + 1) & 0x60ffffff | 0x81000000;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 4000;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(16000);
  pVVar4->pArray = piVar5;
  pIVar2->vArgs = pVVar4;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 1000;
  pVVar6->nSize = 0;
  piVar5 = (int *)malloc(4000);
  pVVar6->pArray = piVar5;
  pIVar2->vRes = pVVar6;
  pHVar7 = (Hsh_IntMan_t *)calloc(1,0x20);
  pHVar7->nSize = 4;
  pHVar7->vData = pVVar4;
  uVar11 = 999;
  while( true ) {
    do {
      uVar10 = uVar11;
      uVar11 = uVar10 + 1;
    } while ((uVar10 & 1) != 0);
    if (uVar11 < 9) break;
    iVar12 = 5;
    while (uVar11 % (iVar12 - 2U) != 0) {
      uVar1 = iVar12 * iVar12;
      iVar12 = iVar12 + 2;
      if (uVar11 < uVar1) goto LAB_0040ab6c;
    }
  }
LAB_0040ab6c:
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  uVar1 = 0x10;
  if (0xe < uVar10) {
    uVar1 = uVar11;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = uVar1;
  piVar5 = (int *)malloc((long)(int)uVar1 << 2);
  pVVar4->pArray = piVar5;
  pVVar4->nSize = uVar11;
  memset(piVar5,0xff,(long)(int)uVar11 << 2);
  pHVar7->vTable = pVVar4;
  pVVar8 = (Vec_Wrd_t *)malloc(0x10);
  pVVar8->nCap = 1000;
  pVVar8->nSize = 0;
  pwVar9 = (word *)malloc(8000);
  pVVar8->pArray = pwVar9;
  pHVar7->vObjs = pVVar8;
  pIVar2->vHash = pHVar7;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar4->pArray = piVar5;
  pIVar2->vMarks = pVVar4;
  Vec_IntPush(pVVar4,0);
  Vec_IntPush(pVVar4,1);
  Vec_IntPush(pVVar4,2);
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 1000;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(4000);
  pVVar4->pArray = piVar5;
  pIVar2->vSuper = pVVar4;
  pVVar8 = (Vec_Wrd_t *)malloc(0x10);
  pVVar8->nCap = 1000;
  pVVar8->nSize = 0;
  pwVar9 = (word *)malloc(8000);
  pVVar8->pArray = pwVar9;
  pIVar2->vTruths = pVVar8;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 1000;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(4000);
  pVVar4->pArray = piVar5;
  pIVar2->vClauses = pVVar4;
  return pIVar2;
}

Assistant:

Ifd_Man_t * Ifd_ManStart()
{
    Ifd_Man_t * p;
    p = ABC_CALLOC( Ifd_Man_t, 1 );
    p->nObjsAlloc = Abc_PrimeCudd( 50000000 );
    p->nObjs      = 2;
    p->pObjs      = ABC_CALLOC( Ifd_Obj_t, p->nObjsAlloc );
    memset( p->pObjs, 0xFF, sizeof(Ifd_Obj_t) ); // const node
    (p->pObjs + 1)->nSupp = 1;  // variable
    (p->pObjs + 1)->fWay  = 1;  // variable
    // hashing operations
    p->vArgs      = Vec_IntAlloc( 4000 );
    p->vRes       = Vec_IntAlloc( 1000 );
    p->vHash      = Hsh_IntManStart( p->vArgs, 4, 1000 );
    p->vMarks     = Vec_IntAlloc( 100 );
    Vec_IntPush( p->vMarks, 0 );
    Vec_IntPush( p->vMarks, 1 );
    Vec_IntPush( p->vMarks, p->nObjs );
    // other data
    p->vSuper     = Vec_IntAlloc( 1000 );
    p->vTruths    = Vec_WrdAlloc( 1000 );
    p->vClauses   = Vec_IntAlloc( 1000 );
    return p;
}